

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O2

void deqp::evalSwitchUniform(ShaderEvalContext *evalCtx)

{
  Vector<float,_3> local_28;
  VecAccess<float,_4,_3> local_18;
  
  local_28.m_data[2] = (evalCtx->coords).m_data[3];
  local_28.m_data._0_8_ = *(undefined8 *)((evalCtx->coords).m_data + 1);
  local_18.m_vector = &evalCtx->color;
  local_18.m_index[0] = 0;
  local_18.m_index[1] = 1;
  local_18.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_18,&local_28);
  return;
}

Assistant:

static void evalSwitchUniform(ShaderEvalContext& evalCtx)
{
	evalCtx.color.xyz() = evalCtx.coords.swizzle(1, 2, 3);
}